

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# goeslrit.cc
# Opt level: O1

string * filename_abi_cxx11_(string *__return_storage_ptr__,
                            unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
                            *spdu)

{
  _Base_ptr p_Var1;
  SessionPDU *pSVar2;
  long lVar3;
  char cVar4;
  ulong uVar5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  NOAALRITHeader NVar8;
  SegmentIdentificationHeader sih;
  PrimaryHeader ph;
  stringstream suffix;
  long *local_1f0;
  long local_1e0 [2];
  SegmentIdentificationHeader local_1ca;
  PrimaryHeader local_1b8;
  stringstream local_1a0 [16];
  long local_190 [2];
  undefined8 auStack_180 [12];
  ios_base local_120 [112];
  char acStack_b0 [152];
  
  assembler::SessionPDU::getName_abi_cxx11_
            (__return_storage_ptr__,
             (spdu->_M_t).
             super___uniq_ptr_impl<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
             ._M_t.
             super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>
             .super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl);
  pSVar2 = (spdu->_M_t).
           super___uniq_ptr_impl<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
           ._M_t.
           super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>
           .super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl;
  lrit::getHeader<lrit::PrimaryHeader>(&local_1b8,&pSVar2->buf_,&pSVar2->m_);
  pSVar2 = (spdu->_M_t).
           super___uniq_ptr_impl<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
           ._M_t.
           super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>
           .super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl;
  NVar8 = lrit::getHeader<lrit::NOAALRITHeader>(&pSVar2->buf_,&pSVar2->m_);
  if ((local_1b8.fileType == '\0') && ((NVar8._8_4_ & 0xfffc | 2) == 0x12)) {
    pSVar2 = (spdu->_M_t).
             super___uniq_ptr_impl<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
             ._M_t.
             super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>
             .super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl;
    p_Var1 = (_Base_ptr)((long)&(pSVar2->m_)._M_t + 8);
    p_Var6 = p_Var1;
    for (p_Var7 = *(_Base_ptr *)((long)&(pSVar2->m_)._M_t + 0x10); p_Var7 != (_Base_ptr)0x0;
        p_Var7 = (&p_Var7->_M_left)[(int)p_Var7[1]._M_color < 0x80]) {
      if (0x7f < (int)p_Var7[1]._M_color) {
        p_Var6 = p_Var7;
      }
    }
    p_Var7 = p_Var1;
    if ((p_Var6 != p_Var1) && (p_Var7 = p_Var6, 0x80 < (int)p_Var6[1]._M_color)) {
      p_Var7 = p_Var1;
    }
    if (p_Var7 != p_Var1) {
      lrit::getHeader<lrit::SegmentIdentificationHeader>(&local_1ca,&pSVar2->buf_,&pSVar2->m_);
      std::__cxx11::stringstream::stringstream(local_1a0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"_",1);
      lVar3 = *(long *)(local_190[0] + -0x18);
      if (acStack_b0[lVar3 + 1] == '\0') {
        cVar4 = std::ios::widen((char)(ostream *)local_190 + (char)lVar3);
        acStack_b0[lVar3] = cVar4;
        acStack_b0[lVar3 + 1] = '\x01';
      }
      acStack_b0[lVar3] = '0';
      *(undefined8 *)((long)auStack_180 + *(long *)(local_190[0] + -0x18)) = 3;
      std::ostream::_M_insert<unsigned_long>((ulong)local_190);
      uVar5 = std::__cxx11::string::rfind
                        ((char *)__return_storage_ptr__,0x13f01a,0xffffffffffffffff);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::replace
                ((ulong)__return_storage_ptr__,uVar5,(char *)0x0,(ulong)local_1f0);
      if (local_1f0 != local_1e0) {
        operator_delete(local_1f0,local_1e0[0] + 1);
      }
      std::__cxx11::stringstream::~stringstream(local_1a0);
      std::ios_base::~ios_base(local_120);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string filename(std::unique_ptr<assembler::SessionPDU>& spdu) {
  auto out = spdu->getName();
  auto ph = spdu->getHeader<lrit::PrimaryHeader>();
  auto nlh = spdu->getHeader<lrit::NOAALRITHeader>();
  auto pid = nlh.productID;

  // Special case GOES-R series.
  if (ph.fileType == 0 && (pid == 16 || pid == 17 || pid == 18 || pid == 19)) {
    // Some image files are segmented but have the same annotation.
    // To prevent overwriting earlier files, include the segment number.
    if (spdu->hasHeader<lrit::SegmentIdentificationHeader>()) {
      auto sih = spdu->getHeader<lrit::SegmentIdentificationHeader>();
      std::stringstream suffix;
      suffix << "_" << std::setfill('0') << std::setw(3) << sih.segmentNumber;
      out.insert(out.rfind(".lrit"), suffix.str());
    }
  }

  return out;
}